

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

void __thiscall TcpServerImpl::Delete(TcpServerImpl *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  int *piVar1;
  
  while (piVar1 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
        (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar1) {
    close(*piVar1);
    std::vector<int,_std::allocator<int>_>::erase
              (&this->m_vSock,
               (const_iterator)
               (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  std::mutex::lock(&this->m_mtAcceptList);
  this_00 = &this->m_vSockAccept;
  while (piVar1 = (this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
        (this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar1) {
    shutdown(*piVar1,2);
    close(*(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start);
    std::vector<int,_std::allocator<int>_>::erase
              (this_00,(const_iterator)
                       (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mtAcceptList);
  return;
}

Assistant:

void TcpServerImpl::Delete()
{
    while (m_vSock.size())
    {
        ::closesocket(m_vSock[0]);
        m_vSock.erase(begin(m_vSock));
    }

    lock_guard<mutex> lock(m_mtAcceptList);
    while (m_vSockAccept.size())
    {
        ::shutdown(m_vSockAccept[0], SD_BOTH);
        ::closesocket(m_vSockAccept[0]);
        m_vSockAccept.erase(begin(m_vSockAccept));
    }
}